

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int StartExpressScanRequestRPLIDAR(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  int local_30;
  int local_2c;
  int DataType;
  int SendMode;
  int DataResponseLength;
  uchar reqbuf [9];
  RPLIDAR *pRPLIDAR_local;
  
  stack0xffffffffffffffdf = 0x582a5;
  reqbuf[0] = '\"';
  DataType = 0;
  local_2c = 0;
  local_30 = 0;
  reqbuf._1_8_ = pRPLIDAR;
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)((long)&SendMode + 3),9);
  if (iVar1 == 0) {
    iVar1 = GetResponseDescriptorRPLIDAR((RPLIDAR *)reqbuf._1_8_,&DataType,&local_2c,&local_30);
    if (iVar1 == 0) {
      if (((DataType == 0x54) && (local_2c == 1)) && (local_30 == 0x82)) {
        iVar1 = WaitForRS232Port((RS232PORT *)(reqbuf._1_8_ + 0x18),0x5dc,5);
        if (iVar1 == 0) {
          memset((void *)(reqbuf._1_8_ + 0x370),0,0x54);
          iVar1 = GetRawExpressScanDataResponseRPLIDAR
                            ((RPLIDAR *)reqbuf._1_8_,(uchar *)(reqbuf._1_8_ + 0x370),0x54);
          if (iVar1 == 0) {
            pRPLIDAR_local._4_4_ = 0;
          }
          else {
            pRPLIDAR_local._4_4_ = 1;
          }
        }
        else {
          printf("A RPLIDAR is not responding correctly. \n");
          pRPLIDAR_local._4_4_ = 1;
        }
      }
      else {
        printf(
              "A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode. \n"
              );
        pRPLIDAR_local._4_4_ = 0x11;
      }
    }
    else {
      pRPLIDAR_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a RPLIDAR. \n");
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int StartExpressScanRequestRPLIDAR(RPLIDAR* pRPLIDAR)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	//unsigned short scanMode = 0;

	//if (SL_IS_FAIL(pRPLIDAR->drv->getTypicalScanMode(scanMode)))
	//{
	//	printf("A RPLIDAR is not responding correctly : getTypicalScanMode() failed. \n");
	//	return EXIT_FAILURE;
	//}
	if (SL_IS_FAIL(pRPLIDAR->drv->startScanExpress(false, SL_LIDAR_CONF_SCAN_COMMAND_EXPRESS)))
	{
		printf("A RPLIDAR is not responding correctly : startScanExpress() failed. \n");
		return EXIT_FAILURE;
	}
	pRPLIDAR->nodes_cache->clear();
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,EXPRESS_SCAN_REQUEST_RPLIDAR,0x05,0,0,0,0,0,0x22};
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)||
		(SendMode != SINGLE_REQUEST_MULTIPLE_RESPONSE_SEND_MODE_RPLIDAR)||
		(DataType != MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode. \n");
		return EXIT_NOT_IMPLEMENTED;	
	}

	// The first data response might take some time to come, see https://github.com/ENSTABretagneRobotics/Hardware-MATLAB/issues/2...
	if (WaitForRS232Port(&pRPLIDAR->RS232Port, 1500, 5) != EXIT_SUCCESS)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}

	// Receive the first data response (2 data responses needed for angles computation...).
	memset(pRPLIDAR->esdata_prev, 0, sizeof(pRPLIDAR->esdata_prev));
	if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->esdata_prev, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}